

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void pystringtest_pystring_slice(void)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_d91;
  string local_d90 [32];
  string local_d70 [39];
  allocator<char> local_d49;
  string local_d48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  byte local_d04;
  byte local_d03;
  byte local_d02;
  allocator<char> local_d01;
  string local_d00 [32];
  string local_ce0 [39];
  allocator<char> local_cb9;
  string local_cb8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  byte local_c74;
  byte local_c73;
  byte local_c72;
  allocator<char> local_c71;
  string local_c70 [32];
  string local_c50 [39];
  allocator<char> local_c29;
  string local_c28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  byte local_be4;
  byte local_be3;
  byte local_be2;
  allocator<char> local_be1;
  string local_be0 [32];
  string local_bc0 [39];
  allocator<char> local_b99;
  string local_b98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  byte local_b54;
  byte local_b53;
  byte local_b52;
  allocator<char> local_b51;
  string local_b50 [32];
  string local_b30 [39];
  allocator<char> local_b09;
  string local_b08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  byte local_ac4;
  byte local_ac3;
  byte local_ac2;
  allocator<char> local_ac1;
  string local_ac0 [32];
  string local_aa0 [39];
  allocator<char> local_a79;
  string local_a78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  byte local_a34;
  byte local_a33;
  byte local_a32;
  allocator<char> local_a31;
  string local_a30 [32];
  string local_a10 [39];
  allocator<char> local_9e9;
  string local_9e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  byte local_9a4;
  byte local_9a3;
  byte local_9a2;
  allocator<char> local_9a1;
  string local_9a0 [32];
  string local_980 [39];
  allocator<char> local_959;
  string local_958 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  byte local_914;
  byte local_913;
  byte local_912;
  allocator<char> local_911;
  string local_910 [32];
  string local_8f0 [39];
  allocator<char> local_8c9;
  string local_8c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  byte local_884;
  byte local_883;
  byte local_882;
  allocator<char> local_881;
  string local_880 [32];
  string local_860 [39];
  allocator<char> local_839;
  string local_838 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  byte local_7f4;
  byte local_7f3;
  byte local_7f2;
  allocator<char> local_7f1;
  string local_7f0 [32];
  string local_7d0 [39];
  allocator<char> local_7a9;
  string local_7a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  byte local_764;
  byte local_763;
  byte local_762;
  allocator<char> local_761;
  string local_760 [32];
  string local_740 [39];
  allocator<char> local_719;
  string local_718 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  byte local_6d4;
  byte local_6d3;
  byte local_6d2;
  allocator<char> local_6d1;
  string local_6d0 [32];
  string local_6b0 [39];
  allocator<char> local_689;
  string local_688 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  byte local_644;
  byte local_643;
  byte local_642;
  allocator<char> local_641;
  string local_640 [32];
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  byte local_5b4;
  byte local_5b3;
  byte local_5b2;
  allocator<char> local_5b1;
  string local_5b0 [32];
  string local_590 [39];
  allocator<char> local_569;
  string local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  byte local_524;
  byte local_523;
  byte local_522;
  allocator<char> local_521;
  string local_520 [32];
  string local_500 [39];
  allocator<char> local_4d9;
  string local_4d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  byte local_494;
  byte local_493;
  byte local_492;
  allocator<char> local_491;
  string local_490 [32];
  string local_470 [39];
  allocator<char> local_449;
  string local_448 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  byte local_404;
  byte local_403;
  byte local_402;
  allocator<char> local_401;
  string local_400 [32];
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  byte local_374;
  byte local_373;
  byte local_372;
  allocator<char> local_371;
  string local_370 [32];
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  byte local_2e4;
  byte local_2e3;
  byte local_2e2;
  allocator<char> local_2e1;
  string local_2e0 [32];
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  byte local_254;
  byte local_253;
  byte local_252;
  allocator<char> local_251;
  string local_250 [32];
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  byte local_1c4;
  byte local_1c3;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0 [32];
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  byte local_134;
  byte local_133;
  byte local_132;
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::allocator<char>::allocator();
  local_a2 = 0;
  local_a3 = 0;
  local_a4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
  pystring::slice((string *)&local_28,(int)local_48,0);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7d);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"",&local_a1);
    local_a3 = 1;
    pystring::slice(local_80,(int)local_a0,0);
    local_a4 = 1;
    poVar2 = std::operator<<(poVar2,local_80);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_a4 & 1) != 0) {
    std::__cxx11::string::~string(local_80);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  local_132 = 0;
  local_133 = 0;
  local_134 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"",&local_e9);
  pystring::slice((string *)&local_c8,(int)local_e8,1);
  bVar1 = std::operator==(&local_c8,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7e);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\", 1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_132 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_130,"",&local_131);
    local_133 = 1;
    pystring::slice(local_110,(int)local_130,1);
    local_134 = 1;
    poVar2 = std::operator<<(poVar2,local_110);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_134 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_133 & 1) != 0) {
    std::__cxx11::string::~string(local_130);
  }
  if ((local_132 & 1) != 0) {
    std::allocator<char>::~allocator(&local_131);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  local_1c2 = 0;
  local_1c3 = 0;
  local_1c4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_178,"",&local_179);
  pystring::slice((string *)&local_158,(int)local_178,-1);
  bVar1 = std::operator==(&local_158,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7f);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\", -1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_1c2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,"",&local_1c1);
    local_1c3 = 1;
    pystring::slice(local_1a0,(int)local_1c0,-1);
    local_1c4 = 1;
    poVar2 = std::operator<<(poVar2,local_1a0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_1c4 & 1) != 0) {
    std::__cxx11::string::~string(local_1a0);
  }
  if ((local_1c3 & 1) != 0) {
    std::__cxx11::string::~string(local_1c0);
  }
  if ((local_1c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1c1);
  }
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  local_252 = 0;
  local_253 = 0;
  local_254 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_208,"",&local_209);
  pystring::slice((string *)&local_1e8,(int)local_208,-1);
  bVar1 = std::operator==(&local_1e8,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\", -1,2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_252 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_250,"",&local_251);
    local_253 = 1;
    pystring::slice(local_230,(int)local_250,-1);
    local_254 = 1;
    poVar2 = std::operator<<(poVar2,local_230);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_254 & 1) != 0) {
    std::__cxx11::string::~string(local_230);
  }
  if ((local_253 & 1) != 0) {
    std::__cxx11::string::~string(local_250);
  }
  if ((local_252 & 1) != 0) {
    std::allocator<char>::~allocator(&local_251);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  local_2e2 = 0;
  local_2e3 = 0;
  local_2e4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_298,"abcdef",&local_299);
  pystring::slice((string *)&local_278,(int)local_298,0);
  bVar1 = std::operator==(&local_278,"abcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x81);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_2e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_2e0,"abcdef",&local_2e1);
    local_2e3 = 1;
    pystring::slice(local_2c0,(int)local_2e0,0);
    local_2e4 = 1;
    poVar2 = std::operator<<(poVar2,local_2c0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_2e4 & 1) != 0) {
    std::__cxx11::string::~string(local_2c0);
  }
  if ((local_2e3 & 1) != 0) {
    std::__cxx11::string::~string(local_2e0);
  }
  if ((local_2e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_2e1);
  }
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  local_372 = 0;
  local_373 = 0;
  local_374 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_328,"abcdef",&local_329);
  pystring::slice((string *)&local_308,(int)local_328,0);
  bVar1 = std::operator==(&local_308,"abcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x82);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",0)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_372 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_370,"abcdef",&local_371);
    local_373 = 1;
    pystring::slice(local_350,(int)local_370,0);
    local_374 = 1;
    poVar2 = std::operator<<(poVar2,local_350);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_374 & 1) != 0) {
    std::__cxx11::string::~string(local_350);
  }
  if ((local_373 & 1) != 0) {
    std::__cxx11::string::~string(local_370);
  }
  if ((local_372 & 1) != 0) {
    std::allocator<char>::~allocator(&local_371);
  }
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  local_402 = 0;
  local_403 = 0;
  local_404 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"abcdef",&local_3b9);
  pystring::slice((string *)&local_398,(int)local_3b8,1);
  bVar1 = std::operator==(&local_398,"bcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x83);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"bcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_402 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_400,"abcdef",&local_401);
    local_403 = 1;
    pystring::slice(local_3e0,(int)local_400,1);
    local_404 = 1;
    poVar2 = std::operator<<(poVar2,local_3e0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"bcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_404 & 1) != 0) {
    std::__cxx11::string::~string(local_3e0);
  }
  if ((local_403 & 1) != 0) {
    std::__cxx11::string::~string(local_400);
  }
  if ((local_402 & 1) != 0) {
    std::allocator<char>::~allocator(&local_401);
  }
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  local_492 = 0;
  local_493 = 0;
  local_494 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_448,"abcdef",&local_449);
  pystring::slice((string *)&local_428,(int)local_448,2);
  bVar1 = std::operator==(&local_428,"cdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x84);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"cdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_492 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_490,"abcdef",&local_491);
    local_493 = 1;
    pystring::slice(local_470,(int)local_490,2);
    local_494 = 1;
    poVar2 = std::operator<<(poVar2,local_470);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"cdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_494 & 1) != 0) {
    std::__cxx11::string::~string(local_470);
  }
  if ((local_493 & 1) != 0) {
    std::__cxx11::string::~string(local_490);
  }
  if ((local_492 & 1) != 0) {
    std::allocator<char>::~allocator(&local_491);
  }
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  std::allocator<char>::allocator();
  local_522 = 0;
  local_523 = 0;
  local_524 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"abcdef",&local_4d9);
  pystring::slice((string *)&local_4b8,(int)local_4d8,2);
  bVar1 = std::operator==(&local_4b8,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x85);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_522 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_520,"abcdef",&local_521);
    local_523 = 1;
    pystring::slice(local_500,(int)local_520,2);
    local_524 = 1;
    poVar2 = std::operator<<(poVar2,local_500);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_524 & 1) != 0) {
    std::__cxx11::string::~string(local_500);
  }
  if ((local_523 & 1) != 0) {
    std::__cxx11::string::~string(local_520);
  }
  if ((local_522 & 1) != 0) {
    std::allocator<char>::~allocator(&local_521);
  }
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::allocator<char>::allocator();
  local_5b2 = 0;
  local_5b3 = 0;
  local_5b4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_568,"abcdef",&local_569);
  pystring::slice((string *)&local_548,(int)local_568,2);
  bVar1 = std::operator==(&local_548,"c");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x86);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,3)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"c\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_5b2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_5b0,"abcdef",&local_5b1);
    local_5b3 = 1;
    pystring::slice(local_590,(int)local_5b0,2);
    local_5b4 = 1;
    poVar2 = std::operator<<(poVar2,local_590);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"c");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_5b4 & 1) != 0) {
    std::__cxx11::string::~string(local_590);
  }
  if ((local_5b3 & 1) != 0) {
    std::__cxx11::string::~string(local_5b0);
  }
  if ((local_5b2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_5b1);
  }
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::allocator<char>::allocator();
  local_642 = 0;
  local_643 = 0;
  local_644 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_5f8,"abcdef",&local_5f9);
  pystring::slice((string *)&local_5d8,(int)local_5f8,2);
  bVar1 = std::operator==(&local_5d8,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x87);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_642 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_640,"abcdef",&local_641);
    local_643 = 1;
    pystring::slice(local_620,(int)local_640,2);
    local_644 = 1;
    poVar2 = std::operator<<(poVar2,local_620);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_644 & 1) != 0) {
    std::__cxx11::string::~string(local_620);
  }
  if ((local_643 & 1) != 0) {
    std::__cxx11::string::~string(local_640);
  }
  if ((local_642 & 1) != 0) {
    std::allocator<char>::~allocator(&local_641);
  }
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::allocator();
  local_6d2 = 0;
  local_6d3 = 0;
  local_6d4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_688,"abcdef",&local_689);
  pystring::slice((string *)&local_668,(int)local_688,2);
  bVar1 = std::operator==(&local_668,"cde");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x88);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"cde\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_6d2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_6d0,"abcdef",&local_6d1);
    local_6d3 = 1;
    pystring::slice(local_6b0,(int)local_6d0,2);
    local_6d4 = 1;
    poVar2 = std::operator<<(poVar2,local_6b0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"cde");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_6d4 & 1) != 0) {
    std::__cxx11::string::~string(local_6b0);
  }
  if ((local_6d3 & 1) != 0) {
    std::__cxx11::string::~string(local_6d0);
  }
  if ((local_6d2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_6d1);
  }
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator(&local_689);
  std::allocator<char>::allocator();
  local_762 = 0;
  local_763 = 0;
  local_764 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_718,"abcdef",&local_719);
  pystring::slice((string *)&local_6f8,(int)local_718,2);
  bVar1 = std::operator==(&local_6f8,"cd");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x89);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"cd\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_762 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_760,"abcdef",&local_761);
    local_763 = 1;
    pystring::slice(local_740,(int)local_760,2);
    local_764 = 1;
    poVar2 = std::operator<<(poVar2,local_740);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"cd");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_764 & 1) != 0) {
    std::__cxx11::string::~string(local_740);
  }
  if ((local_763 & 1) != 0) {
    std::__cxx11::string::~string(local_760);
  }
  if ((local_762 & 1) != 0) {
    std::allocator<char>::~allocator(&local_761);
  }
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator(&local_719);
  std::allocator<char>::allocator();
  local_7f2 = 0;
  local_7f3 = 0;
  local_7f4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_7a8,"abcdef",&local_7a9);
  pystring::slice((string *)&local_788,(int)local_7a8,2);
  bVar1 = std::operator==(&local_788,"c");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8a);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-3)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"c\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_7f2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_7f0,"abcdef",&local_7f1);
    local_7f3 = 1;
    pystring::slice(local_7d0,(int)local_7f0,2);
    local_7f4 = 1;
    poVar2 = std::operator<<(poVar2,local_7d0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"c");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_7f4 & 1) != 0) {
    std::__cxx11::string::~string(local_7d0);
  }
  if ((local_7f3 & 1) != 0) {
    std::__cxx11::string::~string(local_7f0);
  }
  if ((local_7f2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_7f1);
  }
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::allocator<char>::allocator();
  local_882 = 0;
  local_883 = 0;
  local_884 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_838,"abcdef",&local_839);
  pystring::slice((string *)&local_818,(int)local_838,2);
  bVar1 = std::operator==(&local_818,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8b);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-4)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_882 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_880,"abcdef",&local_881);
    local_883 = 1;
    pystring::slice(local_860,(int)local_880,2);
    local_884 = 1;
    poVar2 = std::operator<<(poVar2,local_860);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_884 & 1) != 0) {
    std::__cxx11::string::~string(local_860);
  }
  if ((local_883 & 1) != 0) {
    std::__cxx11::string::~string(local_880);
  }
  if ((local_882 & 1) != 0) {
    std::allocator<char>::~allocator(&local_881);
  }
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator(&local_839);
  std::allocator<char>::allocator();
  local_912 = 0;
  local_913 = 0;
  local_914 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_8c8,"abcdef",&local_8c9);
  pystring::slice((string *)&local_8a8,(int)local_8c8,2);
  bVar1 = std::operator==(&local_8a8,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8c);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-5)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_912 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_910,"abcdef",&local_911);
    local_913 = 1;
    pystring::slice(local_8f0,(int)local_910,2);
    local_914 = 1;
    poVar2 = std::operator<<(poVar2,local_8f0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_914 & 1) != 0) {
    std::__cxx11::string::~string(local_8f0);
  }
  if ((local_913 & 1) != 0) {
    std::__cxx11::string::~string(local_910);
  }
  if ((local_912 & 1) != 0) {
    std::allocator<char>::~allocator(&local_911);
  }
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string(local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  std::allocator<char>::allocator();
  local_9a2 = 0;
  local_9a3 = 0;
  local_9a4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_958,"abcdef",&local_959);
  pystring::slice((string *)&local_938,(int)local_958,-1);
  bVar1 = std::operator==(&local_938,"f");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8d);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"f\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_9a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_9a0,"abcdef",&local_9a1);
    local_9a3 = 1;
    pystring::slice(local_980,(int)local_9a0,-1);
    local_9a4 = 1;
    poVar2 = std::operator<<(poVar2,local_980);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"f");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_9a4 & 1) != 0) {
    std::__cxx11::string::~string(local_980);
  }
  if ((local_9a3 & 1) != 0) {
    std::__cxx11::string::~string(local_9a0);
  }
  if ((local_9a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_9a1);
  }
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  std::allocator<char>::allocator();
  local_a32 = 0;
  local_a33 = 0;
  local_a34 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_9e8,"abcdef",&local_9e9);
  pystring::slice((string *)&local_9c8,(int)local_9e8,-2);
  bVar1 = std::operator==(&local_9c8,"ef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8e);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"ef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_a32 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_a30,"abcdef",&local_a31);
    local_a33 = 1;
    pystring::slice(local_a10,(int)local_a30,-2);
    local_a34 = 1;
    poVar2 = std::operator<<(poVar2,local_a10);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"ef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_a34 & 1) != 0) {
    std::__cxx11::string::~string(local_a10);
  }
  if ((local_a33 & 1) != 0) {
    std::__cxx11::string::~string(local_a30);
  }
  if ((local_a32 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a31);
  }
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  std::allocator<char>::allocator();
  local_ac2 = 0;
  local_ac3 = 0;
  local_ac4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_a78,"abcdef",&local_a79);
  pystring::slice((string *)&local_a58,(int)local_a78,-99);
  bVar1 = std::operator==(&local_a58,"abcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8f);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-99)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_ac2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_ac0,"abcdef",&local_ac1);
    local_ac3 = 1;
    pystring::slice(local_aa0,(int)local_ac0,-99);
    local_ac4 = 1;
    poVar2 = std::operator<<(poVar2,local_aa0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_ac4 & 1) != 0) {
    std::__cxx11::string::~string(local_aa0);
  }
  if ((local_ac3 & 1) != 0) {
    std::__cxx11::string::~string(local_ac0);
  }
  if ((local_ac2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_ac1);
  }
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator(&local_a79);
  std::allocator<char>::allocator();
  local_b52 = 0;
  local_b53 = 0;
  local_b54 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"abcdef",&local_b09);
  pystring::slice((string *)&local_ae8,(int)local_b08,-99);
  bVar1 = std::operator==(&local_ae8,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x90);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-99,-98)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_b52 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_b50,"abcdef",&local_b51);
    local_b53 = 1;
    pystring::slice(local_b30,(int)local_b50,-99);
    local_b54 = 1;
    poVar2 = std::operator<<(poVar2,local_b30);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_b54 & 1) != 0) {
    std::__cxx11::string::~string(local_b30);
  }
  if ((local_b53 & 1) != 0) {
    std::__cxx11::string::~string(local_b50);
  }
  if ((local_b52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_b51);
  }
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::allocator<char>::allocator();
  local_be2 = 0;
  local_be3 = 0;
  local_be4 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_b98,"abcdef",&local_b99);
  pystring::slice((string *)&local_b78,(int)local_b98,-2);
  bVar1 = std::operator==(&local_b78,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x91);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-2, 3)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_be2 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_be0,"abcdef",&local_be1);
    local_be3 = 1;
    pystring::slice(local_bc0,(int)local_be0,-2);
    local_be4 = 1;
    poVar2 = std::operator<<(poVar2,local_bc0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_be4 & 1) != 0) {
    std::__cxx11::string::~string(local_bc0);
  }
  if ((local_be3 & 1) != 0) {
    std::__cxx11::string::~string(local_be0);
  }
  if ((local_be2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_be1);
  }
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string(local_b98);
  std::allocator<char>::~allocator(&local_b99);
  std::allocator<char>::allocator();
  local_c72 = 0;
  local_c73 = 0;
  local_c74 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_c28,"abcdef",&local_c29);
  pystring::slice((string *)&local_c08,(int)local_c28,-2);
  bVar1 = std::operator==(&local_c08,"ef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x92);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-2, 10)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"ef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_c72 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_c70,"abcdef",&local_c71);
    local_c73 = 1;
    pystring::slice(local_c50,(int)local_c70,-2);
    local_c74 = 1;
    poVar2 = std::operator<<(poVar2,local_c50);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"ef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_c74 & 1) != 0) {
    std::__cxx11::string::~string(local_c50);
  }
  if ((local_c73 & 1) != 0) {
    std::__cxx11::string::~string(local_c70);
  }
  if ((local_c72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_c71);
  }
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string(local_c28);
  std::allocator<char>::~allocator(&local_c29);
  std::allocator<char>::allocator();
  local_d02 = 0;
  local_d03 = 0;
  local_d04 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_cb8,"abcdef",&local_cb9);
  pystring::slice((string *)&local_c98,(int)local_cb8,-1);
  bVar1 = std::operator==(&local_c98,"f");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x93);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"f\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    local_d02 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_d00,"abcdef",&local_d01);
    local_d03 = 1;
    pystring::slice(local_ce0,(int)local_d00,-1);
    local_d04 = 1;
    poVar2 = std::operator<<(poVar2,local_ce0);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"f");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
  }
  if ((local_d04 & 1) != 0) {
    std::__cxx11::string::~string(local_ce0);
  }
  if ((local_d03 & 1) != 0) {
    std::__cxx11::string::~string(local_d00);
  }
  if ((local_d02 & 1) != 0) {
    std::allocator<char>::~allocator(&local_d01);
  }
  std::__cxx11::string::~string((string *)&local_c98);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator(&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d48,"abcdef",&local_d49);
  pystring::slice((string *)&local_d28,(int)local_d48,0);
  bVar1 = std::operator==(&local_d28,"abcde");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x94);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",0,-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcde\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d90,"abcdef",&local_d91);
    pystring::slice(local_d70,(int)local_d90,0);
    poVar2 = std::operator<<(poVar2,local_d70);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcde");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_d70);
    std::__cxx11::string::~string(local_d90);
    std::allocator<char>::~allocator(&local_d91);
  }
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string(local_d48);
  std::allocator<char>::~allocator(&local_d49);
  return;
}

Assistant:

PYSTRING_ADD_TEST(pystring, slice)
{
    PYSTRING_CHECK_EQUAL(pystring::slice(""), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("", 1), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("", -1), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("", -1,2), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef"), "abcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",0), "abcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",1), "bcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2), "cdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,2), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,3), "c");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,1), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-1), "cde");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-2), "cd");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-3), "c");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-4), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-5), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-1), "f");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-2), "ef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-99), "abcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-99,-98), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-2, 3), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-2, 10), "ef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-1), "f");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",0,-1), "abcde");
}